

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

size_t __thiscall
OpenMesh::PropertyT<OpenMesh::VectorT<float,_3>_>::store
          (PropertyT<OpenMesh::VectorT<float,_3>_> *this,ostream *_ostr,bool _swap)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  lVar1 = (**(code **)(*(long *)this + 0x58))();
  if (lVar1 == 0) {
    sVar5 = 0;
  }
  else {
    lVar1 = 0;
    uVar4 = 0;
    sVar5 = 0;
    do {
      sVar2 = IO::binary<OpenMesh::VectorT<float,_3>_>::store
                        (_ostr,(value_type *)
                               ((long)(((this->data_).
                                        super__Vector_base<OpenMesh::VectorT<float,_3>,_std::allocator<OpenMesh::VectorT<float,_3>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->values_).
                                      _M_elems + lVar1),_swap);
      sVar5 = sVar5 + sVar2;
      uVar4 = uVar4 + 1;
      uVar3 = (**(code **)(*(long *)this + 0x58))(this);
      lVar1 = lVar1 + 0xc;
    } while (uVar4 < uVar3);
  }
  return sVar5;
}

Assistant:

virtual size_t store( std::ostream& _ostr, bool _swap ) const
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::store(_ostr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::store( _ostr, data_[i], _swap );
    return bytes;
  }